

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int freeSpace(MemPage *pPage,u16 iStart,u16 iSize)

{
  ulong uVar1;
  u8 *puVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  undefined8 uVar10;
  uint uVar11;
  undefined6 in_register_00000012;
  ulong uVar12;
  undefined6 in_register_00000032;
  byte bVar13;
  ulong uVar14;
  ulong uVar15;
  int local_54;
  ushort local_50;
  
  uVar9 = (uint)CONCAT62(in_register_00000032,iStart);
  uVar14 = CONCAT62(in_register_00000032,iStart) & 0xffffffff;
  iVar3 = (int)CONCAT62(in_register_00000012,iSize);
  uVar11 = iVar3 + uVar9;
  puVar2 = pPage->aData;
  uVar12 = (ulong)pPage->hdrOffset;
  uVar1 = uVar12 + 1;
  uVar6 = uVar1;
  local_54 = iVar3;
  if ((puVar2[uVar12 + 2] == '\0') && (puVar2[uVar1] == '\0')) {
    local_50 = 0;
    uVar15 = uVar1;
  }
  else {
    do {
      uVar15 = uVar6;
      uVar7 = *(ushort *)(puVar2 + uVar15);
      local_50 = uVar7 << 8 | uVar7 >> 8;
      uVar6 = (ulong)local_50;
      if ((ushort)uVar14 <= local_50) goto LAB_001683ba;
    } while ((ushort)uVar15 < local_50);
    if (local_50 != 0) {
      uVar10 = 0x11110;
      goto LAB_001683f3;
    }
LAB_001683ba:
    uVar5 = pPage->pBt->usableSize;
    uVar8 = (uint)local_50;
    if (uVar5 - 4 < uVar8) {
      uVar10 = 0x11115;
      goto LAB_001683f3;
    }
    if (uVar11 + 3 < uVar8 || local_50 == 0) {
      bVar13 = 0;
    }
    else {
      bVar13 = (char)(uVar7 >> 8) - (char)uVar11;
      if (local_50 < uVar11) {
        uVar10 = 0x11121;
        goto LAB_001683f3;
      }
      uVar11 = (ushort)(*(ushort *)(puVar2 + uVar6 + 2) << 8 | *(ushort *)(puVar2 + uVar6 + 2) >> 8)
               + uVar8;
      if (uVar5 < uVar11) {
        uVar10 = 0x11124;
        goto LAB_001683f3;
      }
      local_54 = uVar11 - uVar9;
      local_50 = *(ushort *)(puVar2 + uVar6) << 8 | *(ushort *)(puVar2 + uVar6) >> 8;
    }
    uVar5 = (uint)uVar15;
    if ((uint)uVar1 < uVar5) {
      uVar7 = *(ushort *)(puVar2 + uVar15 + 2) << 8 | *(ushort *)(puVar2 + uVar15 + 2) >> 8;
      bVar4 = true;
      if (uVar9 <= uVar7 + uVar5 + 3) {
        uVar8 = uVar7 + uVar5;
        if (uVar9 < uVar8) {
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x11131,
                      "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
          bVar4 = false;
        }
        else {
          bVar13 = bVar13 + ((char)iStart - (char)uVar8);
          local_54 = uVar11 - uVar5;
          uVar14 = uVar15;
          bVar4 = true;
        }
      }
      if (!bVar4) {
        return 0xb;
      }
    }
    if (puVar2[uVar12 + 7] < bVar13) {
      uVar10 = 0x11137;
      goto LAB_001683f3;
    }
    puVar2[uVar12 + 7] = puVar2[uVar12 + 7] - bVar13;
  }
  uVar6 = uVar14 & 0xffff;
  uVar9 = (uint)(ushort)(*(ushort *)(puVar2 + uVar12 + 5) << 8 |
                        *(ushort *)(puVar2 + uVar12 + 5) >> 8);
  if ((uint)uVar6 <= uVar9) {
    if ((uint)uVar6 < uVar9) {
      uVar10 = 0x11140;
    }
    else {
      if ((uint)uVar1 == (uint)uVar15) {
        *(ushort *)(puVar2 + uVar1) = local_50 << 8 | local_50 >> 8;
        puVar2[uVar12 + 5] = (u8)(uVar11 >> 8);
        puVar2[uVar12 + 6] = (u8)uVar11;
        goto LAB_001685db;
      }
      uVar10 = 0x11141;
    }
LAB_001683f3:
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar10,
                "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
    return 0xb;
  }
  *(ushort *)(puVar2 + uVar15) = (ushort)uVar14 << 8 | (ushort)uVar14 >> 8;
LAB_001685db:
  if ((pPage->pBt->btsFlags & 0xc) != 0) {
    memset(puVar2 + uVar6,0,(ulong)(ushort)local_54);
  }
  puVar2[uVar6] = (u8)(local_50 >> 8);
  puVar2[uVar6 + 1] = (u8)local_50;
  puVar2[uVar6 + 2] = (u8)((uint)local_54 >> 8);
  puVar2[uVar6 + 3] = (u8)local_54;
  pPage->nFree = pPage->nFree + iVar3;
  return 0;
}

Assistant:

static int freeSpace(MemPage *pPage, u16 iStart, u16 iSize){
  u16 iPtr;                             /* Address of ptr to next freeblock */
  u16 iFreeBlk;                         /* Address of the next freeblock */
  u8 hdr;                               /* Page header size.  0 or 100 */
  u8 nFrag = 0;                         /* Reduction in fragmentation */
  u16 iOrigSize = iSize;                /* Original value of iSize */
  u16 x;                                /* Offset to cell content area */
  u32 iEnd = iStart + iSize;            /* First byte past the iStart buffer */
  unsigned char *data = pPage->aData;   /* Page content */
  u8 *pTmp;                             /* Temporary ptr into data[] */

  assert( pPage->pBt!=0 );
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( CORRUPT_DB || iStart>=pPage->hdrOffset+6+pPage->childPtrSize );
  assert( CORRUPT_DB || iEnd <= pPage->pBt->usableSize );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( iSize>=4 );   /* Minimum cell size is 4 */
  assert( iStart<=pPage->pBt->usableSize-4 );

  /* The list of freeblocks must be in ascending order.  Find the
  ** spot on the list where iStart should be inserted.
  */
  hdr = pPage->hdrOffset;
  iPtr = hdr + 1;
  if( data[iPtr+1]==0 && data[iPtr]==0 ){
    iFreeBlk = 0;  /* Shortcut for the case when the freelist is empty */
  }else{
    while( (iFreeBlk = get2byte(&data[iPtr]))<iStart ){
      if( iFreeBlk<=iPtr ){
        if( iFreeBlk==0 ) break; /* TH3: corrupt082.100 */
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      iPtr = iFreeBlk;
    }
    if( iFreeBlk>pPage->pBt->usableSize-4 ){ /* TH3: corrupt081.100 */
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    assert( iFreeBlk>iPtr || iFreeBlk==0 || CORRUPT_DB );

    /* At this point:
    **    iFreeBlk:   First freeblock after iStart, or zero if none
    **    iPtr:       The address of a pointer to iFreeBlk
    **
    ** Check to see if iFreeBlk should be coalesced onto the end of iStart.
    */
    if( iFreeBlk && iEnd+3>=iFreeBlk ){
      nFrag = iFreeBlk - iEnd;
      if( iEnd>iFreeBlk ) return SQLITE_CORRUPT_PAGE(pPage);
      iEnd = iFreeBlk + get2byte(&data[iFreeBlk+2]);
      if( iEnd > pPage->pBt->usableSize ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      iSize = iEnd - iStart;
      iFreeBlk = get2byte(&data[iFreeBlk]);
    }

    /* If iPtr is another freeblock (that is, if iPtr is not the freelist
    ** pointer in the page header) then check to see if iStart should be
    ** coalesced onto the end of iPtr.
    */
    if( iPtr>hdr+1 ){
      int iPtrEnd = iPtr + get2byte(&data[iPtr+2]);
      if( iPtrEnd+3>=iStart ){
        if( iPtrEnd>iStart ) return SQLITE_CORRUPT_PAGE(pPage);
        nFrag += iStart - iPtrEnd;
        iSize = iEnd - iPtr;
        iStart = iPtr;
      }
    }
    if( nFrag>data[hdr+7] ) return SQLITE_CORRUPT_PAGE(pPage);
    data[hdr+7] -= nFrag;
  }
  pTmp = &data[hdr+5];
  x = get2byte(pTmp);
  if( iStart<=x ){
    /* The new freeblock is at the beginning of the cell content area,
    ** so just extend the cell content area rather than create another
    ** freelist entry */
    if( iStart<x ) return SQLITE_CORRUPT_PAGE(pPage);
    if( iPtr!=hdr+1 ) return SQLITE_CORRUPT_PAGE(pPage);
    put2byte(&data[hdr+1], iFreeBlk);
    put2byte(&data[hdr+5], iEnd);
  }else{
    /* Insert the new freeblock into the freelist */
    put2byte(&data[iPtr], iStart);
  }
  if( pPage->pBt->btsFlags & BTS_FAST_SECURE ){
    /* Overwrite deleted information with zeros when the secure_delete
    ** option is enabled */
    memset(&data[iStart], 0, iSize);
  }
  put2byte(&data[iStart], iFreeBlk);
  put2byte(&data[iStart+2], iSize);
  pPage->nFree += iOrigSize;
  return SQLITE_OK;
}